

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlPedanticParserDefault(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 in_RAX;
  PyObject *pPVar2;
  int val;
  undefined4 local_14;
  
  local_14 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = libxml_deprecationWarning("xmlPedanticParserDefault");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"i:xmlPedanticParserDefault",&local_14);
    if (iVar1 != 0) {
      iVar1 = xmlPedanticParserDefault(local_14);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlPedanticParserDefault(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    int val;

    if (libxml_deprecationWarning("xmlPedanticParserDefault") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"i:xmlPedanticParserDefault", &val))
        return(NULL);

    c_retval = xmlPedanticParserDefault(val);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}